

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

Vector3 * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements
          (Vector3 *__return_storage_ptr__,ThreeAxisForceTorqueContactSensor *this,
          VectorDynSize *loadCellMeasurements)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  uint i;
  ulong uVar4;
  double *pdVar5;
  Wrench loadCellWrench;
  Wrench totalWrench;
  Transform sensor_H_loadCell;
  Wrench local_180;
  undefined1 local_148 [16];
  undefined8 uStack_138;
  double local_130;
  double adStack_128 [3];
  Transform local_110 [56];
  SpatialForceVector local_d8 [72];
  Transform local_90 [96];
  
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 == ((long)(this->pimpl->m_loadCellLocations).
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->pimpl->m_loadCellLocations).
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    pdVar3 = (double *)(local_148 + 8);
    adStack_128[1] = 0.0;
    adStack_128[2] = 0.0;
    local_130 = 0.0;
    adStack_128[0] = 0.0;
    local_148._8_8_ = 0;
    uStack_138 = 0;
    local_148._0_8_ = &PTR__SpatialForceVector_00184f48;
    uVar4 = 0;
    do {
      pdVar5 = adStack_128 + ((int)uVar4 - 3);
      if (uVar4 < 3) {
        pdVar5 = pdVar3;
      }
      *pdVar5 = 0.0;
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (uVar4 != 6);
    lVar1 = 0;
    uVar4 = 0;
    while( true ) {
      uVar2 = iDynTree::VectorDynSize::size();
      if (uVar2 <= uVar4) break;
      pdVar3 = (double *)iDynTree::VectorDynSize::operator()(loadCellMeasurements,uVar4);
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)local_90,0.0,0.0,*pdVar3);
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)local_d8,0.0,0.0,0.0);
      iDynTree::Wrench::Wrench(&local_180,(GeomVector3 *)local_90,(GeomVector3 *)local_d8);
      iDynTree::Rotation::Identity();
      iDynTree::Transform::Transform
                (local_90,(Rotation *)local_d8,
                 (this->pimpl->m_loadCellLocations).
                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar1);
      iDynTree::Transform::operator*(local_110,(Wrench *)local_90);
      iDynTree::Wrench::operator+((Wrench *)local_d8,(Wrench *)local_148);
      iDynTree::Wrench::operator=((Wrench *)local_148,(Wrench *)local_d8);
      iDynTree::SpatialForceVector::~SpatialForceVector(local_d8);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_110);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_180.super_SpatialForceVector);
      uVar4 = uVar4 + 1;
      lVar1 = lVar1 + 0x18;
    }
    __return_storage_ptr__->m_data[0] = local_130;
    __return_storage_ptr__->m_data[1] = adStack_128[0];
    __return_storage_ptr__->m_data[2] = adStack_128[1];
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_148);
  }
  else {
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements has the wrong size");
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3  ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Vector3 zero; zero.zero();
        return zero;
    }

    Wrench totalWrench;
    totalWrench.zero();

    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        // We assume that the total forcetorque is given by the sum of pure forces on the z axis measured by the load cells
        Wrench loadCellWrench = Wrench(LinearForceVector3(0.0, 0.0, loadCellMeasurements(i)*1.0), AngularForceVector3(0.0, 0.0, 0.0));
        Transform sensor_H_loadCell(Rotation::Identity(), pimpl->m_loadCellLocations[i]);
        totalWrench = totalWrench + sensor_H_loadCell*loadCellWrench;
    }

    // Project the force torque
    Vector3 ret;
    ret(0) = totalWrench.getLinearVec3()(2);
    ret(1) = totalWrench.getAngularVec3()(0);
    ret(2) = totalWrench.getAngularVec3()(1);

    return ret;
}